

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Version::~Version(Version *this)

{
  FileMetaData *pFVar1;
  reference ppFVar2;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_48;
  FileMetaData *f;
  size_t i;
  int level;
  Version *this_local;
  
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x45,"leveldb::Version::~Version()");
  }
  this->prev_->next_ = this->next_;
  this->next_->prev_ = this->prev_;
  i._4_4_ = 0;
  do {
    if (6 < i._4_4_) {
      local_48 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &this->file_to_compact_;
      do {
        local_48 = local_48 + -1;
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                  (local_48);
      } while (local_48 != this->files_);
      return;
    }
    for (f = (FileMetaData *)0x0;
        pFVar1 = (FileMetaData *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(this->files_ + i._4_4_), f < pFVar1; f = (FileMetaData *)((long)&f->refs + 1))
    {
      ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->files_ + i._4_4_,(size_type)f);
      pFVar1 = *ppFVar2;
      if (pFVar1->refs < 1) {
        __assert_fail("f->refs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x4f,"leveldb::Version::~Version()");
      }
      pFVar1->refs = pFVar1->refs + -1;
      if ((pFVar1->refs < 1) && (pFVar1 != (FileMetaData *)0x0)) {
        FileMetaData::~FileMetaData(pFVar1);
        operator_delete(pFVar1);
      }
    }
    i._4_4_ = i._4_4_ + 1;
  } while( true );
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}